

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O2

void __thiscall TeamCityTestOutput::printEscaped(TeamCityTestOutput *this,char *s)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined2 uVar3;
  undefined8 in_RAX;
  undefined1 *puVar4;
  undefined8 uStack_38;
  
  puVar1 = (undefined1 *)((long)&uStack_38 + 7);
  uStack_38 = in_RAX;
  do {
    bVar2 = *s;
    if (bVar2 == 0) {
      return;
    }
    uVar3 = uStack_38._6_2_;
    puVar4 = puVar1;
    if ((bVar2 - 0x5b < 0x22) && ((0x200000005U >> ((ulong)(bVar2 - 0x5b) & 0x3f) & 1) != 0)) {
LAB_0012fc99:
      uStack_38._0_6_ = CONCAT15(0x7c,(undefined5)uStack_38);
      uStack_38._0_7_ = CONCAT16(bVar2,(undefined6)uStack_38);
    }
    else if (bVar2 == 10) {
      uStack_38._0_7_ = CONCAT25(0x6e7c,(undefined5)uStack_38);
    }
    else if (bVar2 == 0xd) {
      uStack_38._0_7_ = CONCAT25(0x727c,(undefined5)uStack_38);
    }
    else {
      if (bVar2 == 0x27) goto LAB_0012fc99;
      uStack_38._0_6_ = CONCAT15(bVar2,(undefined5)uStack_38);
      uStack_38 = CONCAT26(uVar3,(undefined6)uStack_38);
      puVar4 = (undefined1 *)((long)&uStack_38 + 6);
    }
    *puVar4 = 0;
    (*(this->super_ConsoleTestOutput).super_TestOutput._vptr_TestOutput[10])
              (this,(long)&uStack_38 + 5);
    s = (char *)((byte *)s + 1);
  } while( true );
}

Assistant:

void TeamCityTestOutput::printEscaped(const char* s)
{
    while (*s) {
        char str[3];
        if ((*s == '\'') || (*s == '|') || (*s == '[') || (*s == ']')) {
            str[0] = '|';
            str[1] = *s;
            str[2] = 0;
        } else if (*s == '\r') {
            str[0] = '|';
            str[1] = 'r';
            str[2] = 0;
        } else if (*s == '\n') {
            str[0] = '|';
            str[1] = 'n';
            str[2] = 0;
        } else {
            str[0] = *s;
            str[1] = 0;
        }
        printBuffer(str);
        s++;
    }
}